

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

EnumInfo * __thiscall
Catch::Detail::EnumValuesRegistry::registerEnum
          (EnumValuesRegistry *this,StringRef enumName,StringRef allValueNames,
          vector<int,_std::allocator<int>_> *values)

{
  type pEVar1;
  vector<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>,_std::allocator<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>_>_>
  *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000018;
  undefined1 in_stack_00000020 [16];
  StringRef in_stack_00000030;
  value_type *in_stack_ffffffffffffff78;
  
  makeEnumInfo(in_stack_00000030,(StringRef)in_stack_00000020,in_stack_00000018);
  clara::std::
  vector<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>,_std::allocator<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>_>_>
  ::push_back(in_RDI,in_stack_ffffffffffffff78);
  clara::std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>::
  ~unique_ptr((unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_> *)
              in_RDI);
  clara::std::
  vector<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>,_std::allocator<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>_>_>
  ::back(in_RDI);
  pEVar1 = clara::std::
           unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>::
           operator*((unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
                      *)in_RDI);
  return pEVar1;
}

Assistant:

EnumInfo const& EnumValuesRegistry::registerEnum( StringRef enumName, StringRef allValueNames, std::vector<int> const& values ) {
            m_enumInfos.push_back(makeEnumInfo(enumName, allValueNames, values));
            return *m_enumInfos.back();
        }